

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNsPtr xmlNewReconciledNs(xmlNodePtr tree,xmlNsPtr ns)

{
  int iVar1;
  xmlNsPtr pxVar2;
  uint uVar3;
  xmlNsPtr local_70;
  xmlChar prefix [50];
  
  if (ns == (xmlNsPtr)0x0) {
    return (xmlNsPtr)0x0;
  }
  if (tree->type != XML_ELEMENT_NODE) {
    return (xmlNsPtr)0x0;
  }
  if ((ns->type == XML_NAMESPACE_DECL) &&
     (iVar1 = xmlSearchNsByHrefSafe(tree,ns->href,&local_70), -1 < iVar1)) {
    if (local_70 != (xmlNsPtr)0x0) {
      return local_70;
    }
    if (ns->prefix == (xmlChar *)0x0) {
      builtin_memcpy(prefix,"default",8);
    }
    else {
      snprintf((char *)prefix,0x32,"%.20s");
    }
    iVar1 = xmlSearchNsSafe(tree,prefix,&local_70);
    if (-1 < iVar1) {
      uVar3 = 1;
      while( true ) {
        if (local_70 == (xmlNsPtr)0x0) {
          pxVar2 = xmlNewNs(tree,ns->href,prefix);
          return pxVar2;
        }
        if (uVar3 == 0x3e9) break;
        if (ns->prefix == (xmlChar *)0x0) {
          snprintf((char *)prefix,0x32,"default%d",(ulong)uVar3);
        }
        else {
          snprintf((char *)prefix,0x32,"%.20s%d",ns->prefix,(ulong)uVar3);
        }
        uVar3 = uVar3 + 1;
        iVar1 = xmlSearchNsSafe(tree,prefix,&local_70);
        if (iVar1 < 0) {
          return (xmlNsPtr)0x0;
        }
      }
      return (xmlNsPtr)0x0;
    }
  }
  return (xmlNsPtr)0x0;
}

Assistant:

static xmlNsPtr
xmlNewReconciledNs(xmlNodePtr tree, xmlNsPtr ns) {
    xmlNsPtr def;
    xmlChar prefix[50];
    int counter = 1;
    int res;

    if ((tree == NULL) || (tree->type != XML_ELEMENT_NODE)) {
	return(NULL);
    }
    if ((ns == NULL) || (ns->type != XML_NAMESPACE_DECL)) {
	return(NULL);
    }
    /*
     * Search an existing namespace definition inherited.
     */
    res = xmlSearchNsByHrefSafe(tree, ns->href, &def);
    if (res < 0)
        return(NULL);
    if (def != NULL)
        return(def);

    /*
     * Find a close prefix which is not already in use.
     * Let's strip namespace prefixes longer than 20 chars !
     */
    if (ns->prefix == NULL)
	snprintf((char *) prefix, sizeof(prefix), "default");
    else
	snprintf((char *) prefix, sizeof(prefix), "%.20s", (char *)ns->prefix);

    res = xmlSearchNsSafe(tree, prefix, &def);
    if (res < 0)
        return(NULL);
    while (def != NULL) {
        if (counter > 1000) return(NULL);
	if (ns->prefix == NULL)
	    snprintf((char *) prefix, sizeof(prefix), "default%d", counter++);
	else
	    snprintf((char *) prefix, sizeof(prefix), "%.20s%d",
		(char *)ns->prefix, counter++);
	res = xmlSearchNsSafe(tree, prefix, &def);
        if (res < 0)
            return(NULL);
    }

    /*
     * OK, now we are ready to create a new one.
     */
    def = xmlNewNs(tree, ns->href, prefix);
    return(def);
}